

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Patterns.cpp
# Opt level: O2

Pattern * slang::ast::VariablePattern::fromSyntax(VariablePatternSyntax *syntax,ASTContext *context)

{
  Compilation *comp;
  bool bVar1;
  SourceLocation args;
  Pattern *pPVar2;
  VariablePattern *pVVar3;
  SourceLocation *pSVar4;
  string_view name;
  SourceRange local_40;
  
  comp = ((context->scope).ptr)->compilation;
  name = parsing::Token::valueText(&syntax->variableName);
  pSVar4 = (SourceLocation *)&context->firstTempVar;
  do {
    args = *pSVar4;
    if (args == (SourceLocation)0x0) {
      args = (SourceLocation)Scope::find((context->scope).ptr,name);
      if (((args == (SourceLocation)0x0) || (*(int *)args != 0x47)) ||
         (*(VariablePatternSyntax **)((long)args + 0x38) != syntax)) {
        pPVar2 = Pattern::badPattern(comp,(Pattern *)0x0);
        return pPVar2;
      }
      local_40 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
LAB_002f8af0:
      pVVar3 = BumpAllocator::
               emplace<slang::ast::VariablePattern,slang::ast::PatternVarSymbol_const&,slang::SourceRange>
                         (&comp->super_BumpAllocator,(PatternVarSymbol *)args,&local_40);
      return &pVVar3->super_Pattern;
    }
    bVar1 = std::operator==(*(basic_string_view<char,_std::char_traits<char>_> *)((long)args + 8),
                            name);
    if ((bVar1) && (*(int *)args == 0x47)) {
      local_40 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
      goto LAB_002f8af0;
    }
    pSVar4 = (SourceLocation *)((long)args + 0x158);
  } while( true );
}

Assistant:

Pattern& VariablePattern::fromSyntax(const VariablePatternSyntax& syntax,
                                     const ASTContext& context) {
    // The pattern var has already been created in our scope, so just look it up.
    auto& comp = context.getCompilation();
    auto name = syntax.variableName.valueText();
    auto currVar = context.firstTempVar;
    while (currVar) {
        if (currVar->name == name && currVar->kind == SymbolKind::PatternVar) {
            return *comp.emplace<VariablePattern>(currVar->as<PatternVarSymbol>(),
                                                  syntax.sourceRange());
        }
        currVar = currVar->nextTemp;
    }

    auto var = context.scope->find(name);
    if (!var || var->kind != SymbolKind::PatternVar || var->getSyntax() != &syntax) {
        // Some other error has occurred, likely a duplicate name,
        // so just return an error.
        return badPattern(comp, nullptr);
    }

    return *comp.emplace<VariablePattern>(var->as<PatternVarSymbol>(), syntax.sourceRange());
}